

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_buffer_header(void *buf,size_t bufsiz,char *fid)

{
  flatbuffers_thash_t fVar1;
  int iVar2;
  
  if (((ulong)buf & 3) == 0) {
    if (bufsiz >> 3 < 0x1fffffff) {
      if (bufsiz < 8) {
        iVar2 = 1;
      }
      else if (((fid == (char *)0x0) || (fVar1 = read_thash_identifier(fid), fVar1 == 0)) ||
              (*(flatbuffers_thash_t *)((long)buf + 4) == fVar1)) {
        iVar2 = 0;
      }
      else {
        iVar2 = 2;
      }
    }
    else {
      iVar2 = 6;
    }
  }
  else {
    iVar2 = 5;
  }
  return iVar2;
}

Assistant:

int flatcc_verify_buffer_header(const void *buf, size_t bufsiz, const char *fid)
{
    thash_t id, id2;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);
    /*
     * Even if we specify no fid, the user might later. Therefore
     * require space for it. Not all buffer generators will take this
     * into account, so it is possible to fail an otherwise valid buffer
     * - but such buffers aren't safe.
     */
    verify(bufsiz >= offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    return flatcc_verify_ok;
}